

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug_info_manager.cpp
# Opt level: O3

bool __thiscall
spvtools::opt::analysis::DebugInfoManager::IsDeclareVisibleToInstr
          (DebugInfoManager *this,Instruction *dbg_declare,Instruction *scope)

{
  IRContext *this_00;
  DefUseManager *this_01;
  pointer puVar1;
  byte bVar2;
  uint32_t ancestor_scope_itr;
  uint32_t uVar3;
  uint32_t child_scope;
  Instruction *pIVar4;
  iterator iVar5;
  byte bVar6;
  bool bVar7;
  uint uVar8;
  uint uVar9;
  uint32_t *puVar10;
  uint32_t dbg_local_var_id;
  vector<unsigned_int,_std::allocator<unsigned_int>_> scope_ids;
  uint32_t local_4c;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_48;
  
  if (dbg_declare == (Instruction *)0x0) {
    __assert_fail("dbg_declare != nullptr",
                  "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/debug_info_manager.cpp"
                  ,0x20f,
                  "bool spvtools::opt::analysis::DebugInfoManager::IsDeclareVisibleToInstr(Instruction *, Instruction *)"
                 );
  }
  if (scope == (Instruction *)0x0) {
    __assert_fail("scope != nullptr",
                  "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/debug_info_manager.cpp"
                  ,0x210,
                  "bool spvtools::opt::analysis::DebugInfoManager::IsDeclareVisibleToInstr(Instruction *, Instruction *)"
                 );
  }
  local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (uint32_t *)0x0;
  local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (uint32_t *)0x0;
  local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (uint *)0x0;
  if (scope->opcode_ == OpPhi) {
    local_4c = (scope->dbg_scope_).lexical_scope_;
    uVar9 = 0;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
              (&local_48,(iterator)0x0,&local_4c);
    bVar2 = scope->has_type_id_;
    bVar6 = scope->has_result_id_;
    uVar8 = (bVar6 & 1) + 1;
    if ((bool)bVar2 == false) {
      uVar8 = (uint)bVar6;
    }
    if (uVar8 != (int)((ulong)((long)(scope->operands_).
                                     super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                              (long)(scope->operands_).
                                    super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                                    ._M_impl.super__Vector_impl_data._M_start) >> 4) * -0x55555555)
    {
      do {
        this_00 = this->context_;
        if ((this_00->valid_analyses_ & kAnalysisBegin) == kAnalysisNone) {
          IRContext::BuildDefUseManager(this_00);
          bVar2 = scope->has_type_id_;
          bVar6 = scope->has_result_id_;
        }
        this_01 = (this_00->def_use_mgr_)._M_t.
                  super___uniq_ptr_impl<spvtools::opt::analysis::DefUseManager,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_spvtools::opt::analysis::DefUseManager_*,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
                  .super__Head_base<0UL,_spvtools::opt::analysis::DefUseManager_*,_false>.
                  _M_head_impl;
        uVar8 = (bVar6 & 1) + 1;
        if ((bVar2 & 1) == 0) {
          uVar8 = (uint)bVar6;
        }
        uVar3 = Instruction::GetSingleWordOperand(scope,uVar8 + uVar9);
        pIVar4 = DefUseManager::GetDef(this_01,uVar3);
        if (pIVar4 != (Instruction *)0x0) {
          local_4c = (pIVar4->dbg_scope_).lexical_scope_;
          if (local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_finish ==
              local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<unsigned_int,_std::allocator<unsigned_int>_>::
            _M_realloc_insert<unsigned_int>
                      (&local_48,
                       (iterator)
                       local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                       _M_impl.super__Vector_impl_data._M_finish,&local_4c);
          }
          else {
            *local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_finish = local_4c;
            local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_finish =
                 local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_finish + 1;
          }
        }
        uVar9 = uVar9 + 2;
        bVar2 = scope->has_type_id_;
        bVar6 = scope->has_result_id_;
        uVar8 = (bVar6 & 1) + 1;
        if ((bool)bVar2 == false) {
          uVar8 = (uint)bVar6;
        }
      } while (uVar9 < (int)((ulong)((long)(scope->operands_).
                                           super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                                           ._M_impl.super__Vector_impl_data._M_finish -
                                    (long)(scope->operands_).
                                          super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                                          ._M_impl.super__Vector_impl_data._M_start) >> 4) *
                       -0x55555555 - uVar8);
    }
  }
  else {
    local_4c = (scope->dbg_scope_).lexical_scope_;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
              (&local_48,(iterator)0x0,&local_4c);
  }
  local_4c = Instruction::GetSingleWordOperand(dbg_declare,4);
  iVar5 = std::
          _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_spvtools::opt::Instruction_*>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::Instruction_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
          ::find(&(this->id_to_dbg_inst_)._M_h,&local_4c);
  if (iVar5.
      super__Node_iterator_base<std::pair<const_unsigned_int,_spvtools::opt::Instruction_*>,_false>.
      _M_cur == (__node_type *)0x0) {
    __assert_fail("dbg_local_var_itr != id_to_dbg_inst_.end()",
                  "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/debug_info_manager.cpp"
                  ,0x222,
                  "bool spvtools::opt::analysis::DebugInfoManager::IsDeclareVisibleToInstr(Instruction *, Instruction *)"
                 );
  }
  uVar3 = Instruction::GetSingleWordOperand
                    (*(Instruction **)
                      ((long)iVar5.
                             super__Node_iterator_base<std::pair<const_unsigned_int,_spvtools::opt::Instruction_*>,_false>
                             ._M_cur + 0x10),9);
  puVar1 = local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_finish;
  puVar10 = local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_start;
  if (local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start ==
      local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    bVar7 = false;
  }
  else {
    do {
      child_scope = *puVar10;
      if (child_scope != 0) {
        bVar7 = true;
        if (child_scope == uVar3) goto LAB_00593ed5;
        do {
          child_scope = GetParentScope(this,child_scope);
          if (child_scope == uVar3) break;
        } while (child_scope != 0);
        if (child_scope != 0) goto LAB_00593ed5;
      }
      puVar10 = puVar10 + 1;
    } while (puVar10 != puVar1);
    bVar7 = false;
  }
LAB_00593ed5:
  if (local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (uint32_t *)0x0) {
    operator_delete(local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                    .super__Vector_impl_data._M_start,
                    (long)local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  return bVar7;
}

Assistant:

bool DebugInfoManager::IsDeclareVisibleToInstr(Instruction* dbg_declare,
                                               Instruction* scope) {
  assert(dbg_declare != nullptr);
  assert(scope != nullptr);

  std::vector<uint32_t> scope_ids;
  if (scope->opcode() == spv::Op::OpPhi) {
    scope_ids.push_back(scope->GetDebugScope().GetLexicalScope());
    for (uint32_t i = 0; i < scope->NumInOperands(); i += 2) {
      auto* value = context()->get_def_use_mgr()->GetDef(
          scope->GetSingleWordInOperand(i));
      if (value != nullptr)
        scope_ids.push_back(value->GetDebugScope().GetLexicalScope());
    }
  } else {
    scope_ids.push_back(scope->GetDebugScope().GetLexicalScope());
  }

  uint32_t dbg_local_var_id =
      dbg_declare->GetSingleWordOperand(kDebugDeclareOperandLocalVariableIndex);
  auto dbg_local_var_itr = id_to_dbg_inst_.find(dbg_local_var_id);
  assert(dbg_local_var_itr != id_to_dbg_inst_.end());
  uint32_t decl_scope_id = dbg_local_var_itr->second->GetSingleWordOperand(
      kDebugLocalVariableOperandParentIndex);

  // If the scope of DebugDeclare is an ancestor scope of the instruction's
  // scope, the local variable is visible to the instruction.
  for (uint32_t scope_id : scope_ids) {
    if (scope_id != kNoDebugScope &&
        IsAncestorOfScope(scope_id, decl_scope_id)) {
      return true;
    }
  }
  return false;
}